

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adlmidi.cpp
# Opt level: O0

int adl_getNextBank(ADL_MIDIPlayer *device,ADL_Bank *bank)

{
  bool bVar1;
  OPL3 *pOVar2;
  iterator *this;
  iterator local_60;
  undefined1 local_48 [8];
  iterator it;
  BankMap *map;
  MidiPlayer *play;
  ADL_Bank *bank_local;
  ADL_MIDIPlayer *device_local;
  
  if (device == (ADL_MIDIPlayer *)0x0) {
    device_local._4_4_ = -1;
  }
  else {
    if (device->adl_midiPlayer == (void *)0x0) {
      __assert_fail("play",
                    "/workspace/llm4binary/github/license_c_cmakelists/jpcima[P]adljack/thirdparty/libADLMIDI/src/adlmidi.cpp"
                    ,0x161,"int adl_getNextBank(ADL_MIDIPlayer *, ADL_Bank *)");
    }
    pOVar2 = AdlMIDI_UPtr<OPL3,_ADLMIDI_DefaultDelete<OPL3>_>::operator->
                       ((AdlMIDI_UPtr<OPL3,_ADLMIDI_DefaultDelete<OPL3>_> *)
                        ((long)device->adl_midiPlayer + 0x198));
    it.index = (size_t)&pOVar2->m_insBanks;
    BasicBankMap<OPL3::Bank>::iterator::from_ptrs((iterator *)local_48,bank->pointer);
    this = BasicBankMap<OPL3::Bank>::iterator::operator++((iterator *)local_48);
    BasicBankMap<OPL3::Bank>::end(&local_60,(BasicBankMap<OPL3::Bank> *)it.index);
    bVar1 = BasicBankMap<OPL3::Bank>::iterator::operator==(this,&local_60);
    if (bVar1) {
      device_local._4_4_ = -1;
    }
    else {
      BasicBankMap<OPL3::Bank>::iterator::to_ptrs((iterator *)local_48,bank->pointer);
      device_local._4_4_ = 0;
    }
  }
  return device_local._4_4_;
}

Assistant:

ADLMIDI_EXPORT int adl_getNextBank(ADL_MIDIPlayer *device, ADL_Bank *bank)
{
    if(!device)
        return -1;

    MidiPlayer *play = GET_MIDI_PLAYER(device);
    assert(play);
    Synth::BankMap &map = play->m_synth->m_insBanks;

    Synth::BankMap::iterator it = Synth::BankMap::iterator::from_ptrs(bank->pointer);
    if(++it == map.end())
        return -1;

    it.to_ptrs(bank->pointer);
    return 0;
}